

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser.cc
# Opt level: O3

bool __thiscall DyndepParser::Parse(DyndepParser *this,string *filename,string *input,string *err)

{
  Lexer *this_00;
  StringPiece filename_00;
  StringPiece input_00;
  bool bVar1;
  bool bVar2;
  Token t;
  long *plVar3;
  size_type *psVar4;
  _Alloc_hider _Var5;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = &(this->super_Parser).lexer_;
  filename_00.str_ = (filename->_M_dataplus)._M_p;
  filename_00.len_ = filename->_M_string_length;
  input_00.str_ = (input->_M_dataplus)._M_p;
  input_00.len_ = input->_M_string_length;
  Lexer::Start(this_00,filename_00,input_00);
  bVar2 = false;
switchD_0019714c_caseD_8:
  t = Lexer::ReadToken(this_00);
  switch(t) {
  case ERROR:
    break;
  case BUILD:
    if (!bVar2) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"expected \'ninja_dyndep_version = ...\'","");
      bVar2 = Lexer::Error(this_00,&local_70,err);
LAB_001972a5:
      local_40._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
      _Var5._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return bVar2;
      }
      goto LAB_0019730f;
    }
    bVar1 = ParseEdge(this,err);
LAB_00197163:
    if (bVar1 == false) {
      return false;
    }
    goto switchD_0019714c_caseD_8;
  case COLON:
  case DEFAULT:
  case EQUALS:
  case INCLUDE:
  case INDENT:
    goto switchD_0019714c_caseD_2;
  case IDENT:
    Lexer::UnreadToken(this_00);
    if (!bVar2) {
      bVar1 = ParseDyndepVersion(this,err);
      bVar2 = true;
      goto LAB_00197163;
    }
    local_50[0] = &local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"unexpected ","");
    Lexer::TokenName(IDENT);
    plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_70.field_2._M_allocated_capacity = *psVar4;
      local_70.field_2._8_8_ = plVar3[3];
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar4;
      local_70._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_70._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    bVar2 = Lexer::Error(this_00,&local_70,err);
    goto LAB_001972e7;
  case NEWLINE:
    goto switchD_0019714c_caseD_8;
  default:
    if (t == TEOF) {
      if (bVar2) {
        return true;
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"expected \'ninja_dyndep_version = ...\'","");
      bVar2 = Lexer::Error(this_00,&local_70,err);
      goto LAB_001972a5;
    }
switchD_0019714c_caseD_2:
    local_50[0] = &local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"unexpected ","");
    Lexer::TokenName(t);
    plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_70.field_2._M_allocated_capacity = *psVar4;
      local_70.field_2._8_8_ = plVar3[3];
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar4;
      local_70._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_70._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    bVar2 = Lexer::Error(this_00,&local_70,err);
LAB_001972e7:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    _Var5._M_p = (pointer)local_50[0];
    if (local_50[0] == &local_40) {
      return bVar2;
    }
    goto LAB_0019730f;
  }
  Lexer::DescribeLastError_abi_cxx11_(&local_70,this_00);
  bVar2 = Lexer::Error(this_00,&local_70,err);
  local_40._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
  _Var5._M_p = local_70._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_0019730f:
    operator_delete(_Var5._M_p,local_40._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool DyndepParser::Parse(const string& filename, const string& input,
                         string* err) {
  lexer_.Start(filename, input);

  // Require a supported ninja_dyndep_version value immediately so
  // we can exit before encountering any syntactic surprises.
  bool haveDyndepVersion = false;

  for (;;) {
    Lexer::Token token = lexer_.ReadToken();
    switch (token) {
    case Lexer::BUILD: {
      if (!haveDyndepVersion)
        return lexer_.Error("expected 'ninja_dyndep_version = ...'", err);
      if (!ParseEdge(err))
        return false;
      break;
    }
    case Lexer::IDENT: {
      lexer_.UnreadToken();
      if (haveDyndepVersion)
        return lexer_.Error(string("unexpected ") + Lexer::TokenName(token),
                            err);
      if (!ParseDyndepVersion(err))
        return false;
      haveDyndepVersion = true;
      break;
    }
    case Lexer::ERROR:
      return lexer_.Error(lexer_.DescribeLastError(), err);
    case Lexer::TEOF:
      if (!haveDyndepVersion)
        return lexer_.Error("expected 'ninja_dyndep_version = ...'", err);
      return true;
    case Lexer::NEWLINE:
      break;
    default:
      return lexer_.Error(string("unexpected ") + Lexer::TokenName(token),
                          err);
    }
  }
  return false;  // not reached
}